

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O0

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>>::
check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  undefined8 uVar1;
  bool bVar2;
  const_iterator first;
  const_iterator last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first;
  lazy_ostream *plVar3;
  size_type plaintext_00;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e8;
  uchar *local_1c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  equal_coll_impl local_1a1;
  assertion_result local_1a0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  size_type local_168;
  size_type local_160;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_148;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  size_t local_100;
  size_type local_f8;
  basic_cstring<const_char> local_f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e0;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  undefined1 local_78 [8];
  buffer_type plaintext;
  undefined1 local_30 [8];
  buffer_type ciphertext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *source_local;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>_> *this_local;
  
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)source;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  d_first = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)basic_endec<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                              *)(this + 0x48),
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )first._M_current,
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )last._M_current,d_first);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  local_80._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_88._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_90 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  local_98 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             basic_endec<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
             ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_aes_192_cfb128>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                           *)(this + 0x68),local_80,local_88,
                          (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_90);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a8,0x35,&local_b8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e0,plVar3,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    local_f8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    plaintext_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              ciphertext.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_100 = symmetric_algorithm<&EVP_aes_192_cfb128>::ciphertext_size_for(plaintext_00);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_e0,&local_f0,0x35,1,2,&local_f8,"ciphertext.size()",&local_100,
               "Algorithm::ciphertext_size_for(source.size())");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0x37,&local_120);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_148,plVar3,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    local_160 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    local_168 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ciphertext.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_148,&local_158,0x37,1,2,&local_160,"plaintext.size()",&local_168,
               "source.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x3c,&local_188);
    local_1b0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ciphertext.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1b8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ciphertext.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1c0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    local_1c8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_78);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_1a0,&local_1a1,local_1b0,local_1b8,local_1c0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_1c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e8,plVar3,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion
              (&local_1a0,&local_1e8,&local_1f8,0x3c,1,0xd,4,"source.begin()","source.end()",
               "plaintext.begin()","plaintext.end()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e8);
    boost::test_tools::assertion_result::~assertion_result(&local_1a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void check_roundtrip(const Container& source) {
			buffer_type ciphertext;
			encryptor(source.begin(), source.end(),
			          std::back_inserter(ciphertext));

			buffer_type plaintext;
			decryptor(ciphertext.begin(), ciphertext.end(),
			          std::back_inserter(plaintext));

			BOOST_CHECK_EQUAL(
				ciphertext.size(),
				Algorithm::ciphertext_size_for(source.size())
			);

			BOOST_CHECK_EQUAL(plaintext.size(), source.size());

			BOOST_CHECK_EQUAL_COLLECTIONS(
				source.begin(), source.end(),
				plaintext.begin(), plaintext.end()
			);
		}